

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3VdbeMultiLoad(Vdbe *p,int iDest,char *zTypes,...)

{
  char cVar1;
  char *zP4;
  char in_AL;
  int iVar2;
  int *piVar3;
  undefined8 in_RCX;
  ulong uVar4;
  int op;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar5;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 auStack_f8 [24];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined4 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  ulong local_48;
  int *piStack_40;
  undefined1 *local_38;
  long local_30;
  
  local_38 = auStack_f8;
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Da;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = 0x3000000018;
  piStack_40 = (int *)&stack0x00000008;
  lVar5 = 0;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  do {
    cVar1 = zTypes[lVar5];
    iVar2 = (int)lVar5;
    if (cVar1 == 'i') {
      uVar4 = local_48 & 0xffffffff;
      if (uVar4 < 0x29) {
        local_48 = CONCAT44(local_48._4_4_,(int)local_48 + 8);
        piVar3 = (int *)(local_38 + uVar4);
      }
      else {
        piVar3 = piStack_40;
        piStack_40 = piStack_40 + 2;
      }
      sqlite3VdbeAddOp3(p,0x47,*piVar3,iDest + iVar2,0);
    }
    else {
      if (cVar1 != 's') {
        if (cVar1 == '\0') {
          sqlite3VdbeAddOp3(p,0x54,iDest,iVar2,0);
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          return;
        }
        __stack_chk_fail();
      }
      uVar4 = local_48 & 0xffffffff;
      if (uVar4 < 0x29) {
        local_48 = CONCAT44(local_48._4_4_,(int)local_48 + 8);
        piVar3 = (int *)(local_38 + uVar4);
      }
      else {
        piVar3 = piStack_40;
        piStack_40 = piStack_40 + 2;
      }
      zP4 = *(char **)piVar3;
      op = 0x4b;
      if (zP4 != (char *)0x0) {
        op = 0x76;
      }
      iVar2 = sqlite3VdbeAddOp3(p,op,0,iDest + iVar2,0);
      sqlite3VdbeChangeP4(p,iVar2,zP4,0);
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMultiLoad(Vdbe *p, int iDest, const char *zTypes, ...){
  va_list ap;
  int i;
  char c;
  va_start(ap, zTypes);
  for(i=0; (c = zTypes[i])!=0; i++){
    if( c=='s' ){
      const char *z = va_arg(ap, const char*);
      sqlite3VdbeAddOp4(p, z==0 ? OP_Null : OP_String8, 0, iDest+i, 0, z, 0);
    }else if( c=='i' ){
      sqlite3VdbeAddOp2(p, OP_Integer, va_arg(ap, int), iDest+i);
    }else{
      goto skip_op_resultrow;
    }
  }
  sqlite3VdbeAddOp2(p, OP_ResultRow, iDest, i);
skip_op_resultrow:
  va_end(ap);
}